

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# one-of-test.c++
# Opt level: O2

void __thiscall kj::TestCase101::run(TestCase101 *this)

{
  anon_union_8_1_a8a2e026_for_OneOf<int,_float,_const_char_*>_2 aVar1;
  size_t sVar2;
  OneOf<int,_float,_const_char_*> *extraout_RDX;
  OneOf<int,_float,_const_char_*> *extraout_RDX_00;
  OneOf<int,_float,_const_char_*> *extraout_RDX_01;
  OneOf<int,_float,_const_char_*> *extraout_RDX_02;
  OneOf<int,_float,_const_char_*> *t;
  uint count;
  DebugComparison<kj::StringPtr,_const_char_(&)[4]> _kjCondition;
  OneOf<int,_float,_const_char_*> var;
  NullableValue<kj::OneOf<int,_float,_const_char_*>_> _kj_switch_subject;
  anon_union_8_1_a8a2e026_for_OneOf<int,_float,_const_char_*>_2 local_20;
  long local_18;
  
  var.tag = 0;
  _kjCondition.left.content.ptr = (char *)CONCAT44(_kjCondition.left.content.ptr._4_4_,3);
  _kjCondition.left.content.size_ = (long)"HTTP/1.1 200 OK\r\nContent-Length: 32\r\n\r\nfoo" + 0x27;
  OneOf<int,_float,_const_char_*>::operator=(&var,(OneOf<int,_float,_const_char_*> *)&_kjCondition);
  aVar1 = var.field_1;
  count = 0;
  if (var.tag == 3) {
    sVar2 = strlen((char *)var.field_1);
    _kj_switch_subject.field_1._0_8_ = sVar2 + 1;
    _kj_switch_subject._0_8_ = aVar1;
    kj::_::DebugExpression<kj::StringPtr>::operator==
              (&_kjCondition,(DebugExpression<kj::StringPtr> *)&_kj_switch_subject,
               (char (*) [4])0x423c58);
    t = extraout_RDX_00;
    if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[43],kj::_::DebugComparison<kj::StringPtr,char_const(&)[4]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x70,ERROR,
                 "\"failed: expected \" \"kj::StringPtr(s) == \\\"foo\\\"\", _kjCondition",
                 (char (*) [43])"failed: expected kj::StringPtr(s) == \"foo\"",&_kjCondition);
      t = extraout_RDX_01;
    }
    _kjCondition.op.content.size_._0_1_ = count == 0;
    count = count + 1;
  }
  else {
    if (var.tag == 2) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],float&>
                ((Fault *)&_kjCondition,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x74,FAILED,(char *)0x0,"\"expected char*, got float\", n",
                 (char (*) [26])"expected char*, got float",(float *)&var.field_1);
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
    }
    if (var.tag == 1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24],int&>
                ((Fault *)&_kjCondition,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x6d,FAILED,(char *)0x0,"\"expected char*, got int\", i",
                 (char (*) [24])"expected char*, got int",(int *)var.field_1.space);
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
    }
    _kjCondition.op.content.size_._0_1_ = false;
    t = extraout_RDX;
  }
  _kjCondition.left.content.ptr = (char *)&count;
  _kjCondition.left.content.size_ = CONCAT44(_kjCondition.left.content.size_._4_4_,1);
  _kjCondition.right = (char (*) [4])anon_var_dwarf_4fea7;
  _kjCondition.op.content.ptr = &DAT_00000005;
  if (((bool)(char)_kjCondition.op.content.size_ == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[28],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/one-of-test.c++"
               ,0x79,ERROR,"\"failed: expected \" \"count == 1\", _kjCondition",
               (char (*) [28])"failed: expected count == 1",
               (DebugComparison<unsigned_int_&,_int> *)&_kjCondition);
    t = extraout_RDX_02;
  }
  cp<kj::OneOf<int,float,char_const*>>
            ((OneOf<int,_float,_const_char_*> *)&_kjCondition,(kj *)&var,t);
  kj::_::NullableValue<kj::OneOf<int,_float,_const_char_*>_>::NullableValue
            (&_kj_switch_subject,(OneOf<int,_float,_const_char_*> *)&_kjCondition);
  if (_kj_switch_subject.field_1.value.tag == 3) {
    sVar2 = strlen((char *)_kj_switch_subject.field_1.value.field_1);
    local_18 = sVar2 + 1;
    local_20 = _kj_switch_subject.field_1.value.field_1;
    kj::_::DebugExpression<kj::StringPtr>::operator==
              (&_kjCondition,(DebugExpression<kj::StringPtr> *)&local_20,(char (*) [4])0x423c58);
    if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[43],kj::_::DebugComparison<kj::StringPtr,char_const(&)[4]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x81,ERROR,
                 "\"failed: expected \" \"kj::StringPtr(s) == \\\"foo\\\"\", _kjCondition",
                 (char (*) [43])"failed: expected kj::StringPtr(s) == \"foo\"",&_kjCondition);
    }
  }
  else {
    if (_kj_switch_subject.field_1.value.tag == 1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24],int&>
                ((Fault *)&_kjCondition,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x7e,FAILED,(char *)0x0,"\"expected char*, got int\", i",
                 (char (*) [24])"expected char*, got int",
                 (int *)((long)&_kj_switch_subject.field_1 + 8));
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
    }
    if (_kj_switch_subject.field_1.value.tag == 2) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],float&>
                ((Fault *)&_kjCondition,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x84,FAILED,(char *)0x0,"\"expected char*, got float\", n",
                 (char (*) [26])"expected char*, got float",
                 (float *)((long)&_kj_switch_subject.field_1 + 8));
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
    }
  }
  if (var.tag == 3) {
    sVar2 = strlen((char *)var.field_1);
    _kj_switch_subject.field_1._0_8_ = sVar2 + 1;
    _kj_switch_subject._0_8_ = var.field_1;
    kj::_::DebugExpression<kj::StringPtr>::operator==
              (&_kjCondition,(DebugExpression<kj::StringPtr> *)&_kj_switch_subject,
               (char (*) [4])0x423c58);
    if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[43],kj::_::DebugComparison<kj::StringPtr,char_const(&)[4]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x91,ERROR,
                 "\"failed: expected \" \"kj::StringPtr(s) == \\\"foo\\\"\", _kjCondition",
                 (char (*) [43])"failed: expected kj::StringPtr(s) == \"foo\"",&_kjCondition);
    }
  }
  else {
    if (var.tag == 1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24],int_const&>
                ((Fault *)&_kjCondition,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x8e,FAILED,(char *)0x0,"\"expected char*, got int\", i",
                 (char (*) [24])"expected char*, got int",(int *)var.field_1.space);
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
    }
    if (var.tag == 2) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],float_const&>
                ((Fault *)&_kjCondition,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x94,FAILED,(char *)0x0,"\"expected char*, got float\", n",
                 (char (*) [26])"expected char*, got float",(float *)&var.field_1);
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
    }
  }
  return;
}

Assistant:

TEST(OneOf, Switch) {
  OneOf<int, float, const char*> var;
  var = "foo";
  uint count = 0;

  {
    KJ_SWITCH_ONEOF(var) {
      KJ_CASE_ONEOF(i, int) {
        KJ_FAIL_ASSERT("expected char*, got int", i);
      }
      KJ_CASE_ONEOF(s, const char*) {
        KJ_EXPECT(kj::StringPtr(s) == "foo");
        ++count;
      }
      KJ_CASE_ONEOF(n, float) {
        KJ_FAIL_ASSERT("expected char*, got float", n);
      }
    }
  }

  KJ_EXPECT(count == 1);

  {
    KJ_SWITCH_ONEOF(kj::cp(var)) {
      KJ_CASE_ONEOF(i, int) {
        KJ_FAIL_ASSERT("expected char*, got int", i);
      }
      KJ_CASE_ONEOF(s, const char*) {
        KJ_EXPECT(kj::StringPtr(s) == "foo");
      }
      KJ_CASE_ONEOF(n, float) {
        KJ_FAIL_ASSERT("expected char*, got float", n);
      }
    }
  }

  {
    // At one time this failed to compile.
    const auto& constVar = var;
    KJ_SWITCH_ONEOF(constVar) {
      KJ_CASE_ONEOF(i, int) {
        KJ_FAIL_ASSERT("expected char*, got int", i);
      }
      KJ_CASE_ONEOF(s, const char*) {
        KJ_EXPECT(kj::StringPtr(s) == "foo");
      }
      KJ_CASE_ONEOF(n, float) {
        KJ_FAIL_ASSERT("expected char*, got float", n);
      }
    }
  }
}